

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  u64 n;
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  char *pcVar4;
  void *__s;
  int iVar5;
  undefined8 *pOld;
  long lVar6;
  int rc;
  int local_34;
  
  local_34 = 0;
  if (*(int *)((long)pContext + 8) != 0) {
    return *(int *)((long)pContext + 8);
  }
  pOld = *pContext;
  iVar5 = 0x8000;
  if (nToken < 0x8000) {
    iVar5 = nToken;
  }
  iVar1 = 0;
  if (pOld == (undefined8 *)0x0) goto LAB_001cfe3b;
  if (((tflags & 1U) != 0) && (0 < *(int *)(pOld + 3))) {
    n = (long)iVar5 + 0x31;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      __s = sqlite3Malloc(n);
    }
    else {
      __s = (void *)0x0;
    }
    if (__s == (void *)0x0) {
      local_34 = 7;
    }
    else {
      memset(__s,0,n);
      *(void **)((long)__s + 8) = (void *)((long)__s + 0x30);
      memcpy((void *)((long)__s + 0x30),pToken,(long)iVar5);
      iVar5 = *(int *)(pOld + 3);
      *(undefined8 *)((long)__s + 0x18) = pOld[(long)iVar5 * 4 + 3];
      pOld[(long)iVar5 * 4 + 3] = __s;
    }
    goto LAB_001cff2d;
  }
  iVar1 = 0;
  if (pOld == (undefined8 *)0x0) {
LAB_001cfe3b:
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      puVar3 = (undefined8 *)sqlite3Realloc(pOld,(long)iVar1 * 0x20 + 0x140);
    }
    else {
      puVar3 = (undefined8 *)0x0;
    }
    if (puVar3 == (undefined8 *)0x0) {
      local_34 = 7;
    }
    else {
      if (pOld == (undefined8 *)0x0) {
        puVar3[6] = 0;
        puVar3[7] = 0;
        puVar3[4] = 0;
        puVar3[5] = 0;
        puVar3[2] = 0;
        puVar3[3] = 0;
        *puVar3 = 0;
        puVar3[1] = 0;
      }
      *(undefined8 **)pContext = puVar3;
      *(int *)(puVar3 + 3) = iVar1;
      pOld = puVar3;
    }
  }
  else if ((*(byte *)(pOld + 3) & 7) == 0) {
    if (pOld != (undefined8 *)0x0) {
      iVar1 = *(int *)(pOld + 3);
    }
    goto LAB_001cfe3b;
  }
  if (local_34 == 0) {
    lVar6 = (long)*(int *)(pOld + 3);
    *(int *)(pOld + 3) = *(int *)(pOld + 3) + 1;
    pOld[lVar6 * 4 + 6] = 0;
    (pOld + lVar6 * 4 + 6)[1] = 0;
    pOld[lVar6 * 4 + 4] = 0;
    (pOld + lVar6 * 4 + 4)[1] = 0;
    pcVar4 = sqlite3Fts5Strndup(&local_34,pToken,iVar5);
    pOld[lVar6 * 4 + 5] = pcVar4;
  }
LAB_001cff2d:
  *(int *)((long)pContext + 8) = local_34;
  return local_34;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->zTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      memcpy(pSyn->zTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase, 
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->zTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
    }
  }

  pCtx->rc = rc;
  return rc;
}